

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

MontgomeryPoint * ecc_montgomery_point_copy(MontgomeryPoint *orig)

{
  MontgomeryPoint *pMVar1;
  mp_int *pmVar2;
  MontgomeryPoint *mp;
  MontgomeryPoint *orig_local;
  
  pMVar1 = ecc_montgomery_point_new_empty(orig->mc);
  pmVar2 = mp_copy(orig->X);
  pMVar1->X = pmVar2;
  pmVar2 = mp_copy(orig->Z);
  pMVar1->Z = pmVar2;
  return pMVar1;
}

Assistant:

MontgomeryPoint *ecc_montgomery_point_copy(MontgomeryPoint *orig)
{
    MontgomeryPoint *mp = ecc_montgomery_point_new_empty(orig->mc);
    mp->X = mp_copy(orig->X);
    mp->Z = mp_copy(orig->Z);
    return mp;
}